

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

string * cmGlobalGhsMultiGenerator::TrimQuotes(string *__return_storage_ptr__,string *str)

{
  char local_11;
  
  ::cm::erase<char,std::char_traits<char>,std::allocator<char>,char>(str,&local_11);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGhsMultiGenerator::TrimQuotes(std::string str)
{
  cm::erase(str, '"');
  return str;
}